

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O2

void __thiscall
QTlsPrivate::TlsCryptographOpenSSL::alertMessageReceived(TlsCryptographOpenSSL *this,int value)

{
  QSslSocket *pQVar1;
  AlertLevel AVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->q;
  AVar2 = anon_unknown.dwarf_12583a::tlsAlertLevel(value);
  anon_unknown.dwarf_12583a::tlsAlertDescription((QString *)&QStack_48,value);
  QSslSocket::alertReceived((AlertLevel)pQVar1,AVar2,(QString *)((ulong)(uint)value & 0xff));
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TlsCryptographOpenSSL::alertMessageReceived(int value)
{
    Q_ASSERT(q);

    emit q->alertReceived(tlsAlertLevel(value), tlsAlertType(value), tlsAlertDescription(value));
}